

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCUtil.h
# Opt level: O0

void __thiscall Assimp::IFC::CurveError::~CurveError(CurveError *this)

{
  CurveError *this_local;
  
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

CurveError(const std::string& s)
    : mStr(s) {
        // empty
    }